

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall
QPDFWriter::writeObjectStreamOffsets
          (QPDFWriter *this,vector<long_long,_std::allocator<long_long>_> *offsets,int first_obj)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  long *plVar4;
  element_type *peVar5;
  uint uVar6;
  long *__n;
  void *__n_00;
  char cVar7;
  void *pvVar8;
  uint __uval;
  void *__val;
  uint uVar9;
  ulong *puVar10;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id;
  long *local_78;
  void *local_70;
  long local_68 [2];
  long *local_58;
  void *local_50;
  long local_48;
  long lStack_40;
  ulong *local_38;
  
  if (first_obj < 1) {
    __assert_fail("first_obj > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc"
                  ,0x65c,
                  "void QPDFWriter::writeObjectStreamOffsets(std::vector<qpdf_offset_t> &, int)");
  }
  uVar9 = 1;
  if (9 < (uint)first_obj) {
    uVar6 = first_obj;
    uVar3 = 4;
    do {
      uVar9 = uVar3;
      if (uVar6 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_001ed1fa;
      }
      if (uVar6 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_001ed1fa;
      }
      if (uVar6 < 10000) goto LAB_001ed1fa;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar3 = uVar9 + 4;
    } while (bVar2);
    uVar9 = uVar9 + 1;
  }
LAB_001ed1fa:
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar9);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,uVar9,first_obj);
  plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_78,(ulong)local_70,0,'\x01');
  local_58 = &local_48;
  __n = plVar4 + 2;
  if ((long *)*plVar4 == __n) {
    local_48 = *__n;
    lStack_40 = plVar4[3];
  }
  else {
    local_48 = *__n;
    local_58 = (long *)*plVar4;
  }
  local_50 = (void *)plVar4[1];
  *plVar4 = (long)__n;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  puVar10 = (ulong *)(offsets->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                     super__Vector_impl_data._M_start;
  local_38 = (ulong *)(offsets->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
  if (puVar10 != local_38) {
    __n = (long *)CONCAT71((int7)((ulong)__n >> 8),1);
    do {
      peVar5 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((ulong)__n & 1) == 0) {
        __n = (long *)CONCAT71((int7)((ulong)__n >> 8),peVar5->qdf_mode);
        if (peVar5->qdf_mode == true) {
          ::qpdf::pl::Count::write(peVar5->pipeline,0x27aca5,(void *)0x1,(size_t)__n);
          peVar5 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          __n = (long *)CONCAT71((int7)((ulong)__n >> 8),peVar5->qdf_mode);
        }
        if (((ulong)__n & 1) == 0) {
          ::qpdf::pl::Count::write(peVar5->pipeline,0x27ab44,(void *)0x1,(size_t)__n);
          peVar5 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        }
      }
      ::qpdf::pl::Count::write(peVar5->pipeline,(int)local_58,local_50,(size_t)__n);
      __n_00 = local_50;
      if ((long *)((long)local_58 + (long)local_50 + -1) != local_58) {
        do {
          cVar7 = *(char *)((long)local_58 + -2 + (long)__n_00) + '\x01';
          *(char *)((long)local_58 + -2 + (long)__n_00) = cVar7;
          if (cVar7 != ':') goto LAB_001ed36d;
          *(undefined1 *)((long)local_58 + -2 + (long)__n_00) = 0x30;
          __n_00 = (void *)((long)__n_00 - 1);
        } while (__n_00 != (void *)0x1);
      }
      __n_00 = (void *)0x31;
      std::__cxx11::string::insert((ulong)&local_58,0,'\x01');
LAB_001ed36d:
      pvVar1 = (void *)*puVar10;
      __val = (void *)-(long)pvVar1;
      if (0 < (long)pvVar1) {
        __val = pvVar1;
      }
      uVar9 = 1;
      if ((void *)0x9 < __val) {
        __n_00 = __val;
        uVar6 = 4;
        do {
          uVar9 = uVar6;
          if (__n_00 < (void *)0x64) {
            uVar9 = uVar9 - 2;
            goto LAB_001ed3d0;
          }
          if (__n_00 < (void *)0x3e8) {
            uVar9 = uVar9 - 1;
            goto LAB_001ed3d0;
          }
          if (__n_00 < (void *)0x2710) goto LAB_001ed3d0;
          pvVar8 = (void *)((ulong)__n_00 / 10000);
          bVar2 = (void *)0x1869f < __n_00;
          __n_00 = pvVar8;
          uVar6 = uVar9 + 4;
        } while (bVar2);
        uVar9 = uVar9 + 1;
      }
LAB_001ed3d0:
      local_78 = local_68;
      std::__cxx11::string::_M_construct
                ((ulong)&local_78,(char)uVar9 - (char)((long)pvVar1 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                ((char *)((long)local_78 - ((long)pvVar1 >> 0x3f)),uVar9,(unsigned_long_long)__val);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_78,local_70,(size_t)__n_00);
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      puVar10 = puVar10 + 1;
      __n = (long *)0x0;
    } while (puVar10 != local_38);
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27aca5,(void *)0x1,(size_t)__n);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::writeObjectStreamOffsets(std::vector<qpdf_offset_t>& offsets, int first_obj)
{
    qpdf_assert_debug(first_obj > 0);
    bool is_first = true;
    auto id = std::to_string(first_obj) + ' ';
    for (auto& offset: offsets) {
        if (is_first) {
            is_first = false;
        } else {
            writeStringQDF("\n");
            writeStringNoQDF(" ");
        }
        writeString(id);
        util::increment(id, 1);
        writeString(std::to_string(offset));
    }
    writeString("\n");
}